

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int js_string_delete_property(JSContext *ctx,JSValue obj,JSAtom prop)

{
  JSValue obj_00;
  BOOL BVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  JSAtom in_ECX;
  int64_t in_RDX;
  JSValueUnion in_RSI;
  JSContext *in_RDI;
  uint32_t idx;
  
  BVar1 = __JS_AtomIsTaggedInt(in_ECX);
  if (BVar1 != 0) {
    uVar2 = __JS_AtomToUInt32(in_ECX);
    obj_00.tag = in_RDX;
    obj_00.u.float64 = in_RSI.float64;
    uVar3 = js_string_obj_get_length(in_RDI,obj_00);
    if (uVar2 < uVar3) {
      return 0;
    }
  }
  return 1;
}

Assistant:

static int js_string_delete_property(JSContext *ctx,
                                     JSValueConst obj, JSAtom prop)
{
    uint32_t idx;

    if (__JS_AtomIsTaggedInt(prop)) {
        idx = __JS_AtomToUInt32(prop);
        if (idx < js_string_obj_get_length(ctx, obj)) {
            return FALSE;
        }
    }
    return TRUE;
}